

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlGetStringFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,char **pString)

{
  bool bVar1;
  JL_STATUS JVar2;
  char *pcVar3;
  JlDataObject *object;
  JlDataObject *local_10;
  
  if (pString == (char **)0x0 || (KeyName == (char *)0x0 || DictionaryObject == (JlDataObject *)0x0)
     ) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  *pString = (char *)0x0;
  local_10 = (JlDataObject *)0x0;
  JVar2 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_10);
  if (JVar2 != JL_STATUS_SUCCESS) {
    return JVar2;
  }
  if (local_10 == (JlDataObject *)0x0) {
    JVar2 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    JVar2 = JL_STATUS_SUCCESS;
    if (local_10->Type == JL_DATA_TYPE_STRING) {
      pcVar3 = (local_10->field_2).String;
      bVar1 = true;
      goto LAB_0010212f;
    }
    JVar2 = JL_STATUS_WRONG_TYPE;
  }
  pcVar3 = (char *)0x0;
  bVar1 = false;
LAB_0010212f:
  if (bVar1) {
    *pString = pcVar3;
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlGetStringFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        char const**                pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pString )
    {
        *pString = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            char const* stringPtr = NULL;
            jlStatus = JlGetObjectString( object, &stringPtr );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pString = stringPtr;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}